

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O1

uint8_t * Decode(WEBP_CSP_MODE mode,uint8_t *data,size_t data_size,int *width,int *height,
                WebPDecBuffer *keep_info)

{
  int iVar1;
  VP8StatusCode VVar2;
  WebPDecParams params;
  WebPDecBuffer output;
  WebPDecParams local_118;
  WebPDecBuffer local_a8;
  
  iVar1 = WebPInitDecBufferInternal(&local_a8,0x210);
  if (iVar1 != 0) {
    local_118.tmp_y = (uint8_t *)0x0;
    local_118.emit_alpha = (OutputAlphaFunc)0x0;
    local_118.emit_alpha_row = (OutputRowFunc)0x0;
    local_118.memory = (void *)0x0;
    local_118.emit = (OutputFunc)0x0;
    local_118.scaler_v = (WebPRescaler *)0x0;
    local_118.scaler_a = (WebPRescaler *)0x0;
    local_118.scaler_y = (WebPRescaler *)0x0;
    local_118.scaler_u = (WebPRescaler *)0x0;
    local_118.last_y = 0;
    local_118._36_4_ = 0;
    local_118.options = (WebPDecoderOptions *)0x0;
    local_118.tmp_u = (uint8_t *)0x0;
    local_118.tmp_v = (uint8_t *)0x0;
    local_118.output = &local_a8;
    local_a8.colorspace = mode;
    iVar1 = WebPGetInfo(data,data_size,&local_a8.width,&local_a8.height);
    if (iVar1 != 0) {
      if (width != (int *)0x0) {
        *width = local_a8.width;
      }
      if (height != (int *)0x0) {
        *height = local_a8.height;
      }
      VVar2 = DecodeInto(data,data_size,&local_118);
      if (VVar2 == VP8_STATUS_OK) {
        if (keep_info == (WebPDecBuffer *)0x0) {
          return local_a8.u.RGBA.rgba;
        }
        WebPCopyDecBuffer(&local_a8,keep_info);
        return local_a8.u.RGBA.rgba;
      }
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

WEBP_NODISCARD static uint8_t* Decode(WEBP_CSP_MODE mode,
                                      const uint8_t* const data,
                                      size_t data_size, int* const width,
                                      int* const height,
                                      WebPDecBuffer* const keep_info) {
  WebPDecParams params;
  WebPDecBuffer output;

  if (!WebPInitDecBuffer(&output)) {
    return NULL;
  }
  WebPResetDecParams(&params);
  params.output = &output;
  output.colorspace = mode;

  // Retrieve (and report back) the required dimensions from bitstream.
  if (!WebPGetInfo(data, data_size, &output.width, &output.height)) {
    return NULL;
  }
  if (width != NULL) *width = output.width;
  if (height != NULL) *height = output.height;

  // Decode
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  if (keep_info != NULL) {    // keep track of the side-info
    WebPCopyDecBuffer(&output, keep_info);
  }
  // return decoded samples (don't clear 'output'!)
  return WebPIsRGBMode(mode) ? output.u.RGBA.rgba : output.u.YUVA.y;
}